

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_srv_dh.c
# Opt level: O3

wchar_t isobusfs_check_current_dir_access
                  (isobusfs_srv_priv_conflict *priv,char *path,size_t path_size)

{
  wchar_t wVar1;
  uint uVar2;
  char linux_path [4096];
  char acStack_1018 [4096];
  
  wVar1 = isobusfs_path_to_linux_path(priv,path,path_size,acStack_1018,0x1000);
  if (L'\xffffffff' < wVar1) {
    isobusfs_log(4,"convert ISOBUS FS path to linux path: %.*s -> %s",path_size,path,acStack_1018);
    uVar2 = isobusfs_cmn_dh_validate_dir_path(acStack_1018,0);
    wVar1 = (int)uVar2 >> 0x1f & uVar2;
  }
  return wVar1;
}

Assistant:

int isobusfs_check_current_dir_access(struct isobusfs_srv_priv *priv,
				      const char *path, size_t path_size)
{
	char linux_path[ISOBUSFS_SRV_MAX_PATH_LEN];
	int ret;

	ret = isobusfs_path_to_linux_path(priv, path, path_size,
					  linux_path, sizeof(linux_path));
	if (ret < 0)
		return ret;

	pr_debug("convert ISOBUS FS path to linux path: %.*s -> %s",
		 path_size, path, linux_path);

	ret = isobusfs_cmn_dh_validate_dir_path(linux_path, false);
	if (ret < 0)
		return ret;

	return 0;
}